

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall
Lodtalk::AST::MessageSendNode::MessageSendNode
          (MessageSendNode *this,string *selector,Node *receiver,Node *firstArgument)

{
  Node *local_28;
  Node *firstArgument_local;
  Node *receiver_local;
  string *selector_local;
  MessageSendNode *this_local;
  
  local_28 = firstArgument;
  firstArgument_local = receiver;
  receiver_local = (Node *)selector;
  selector_local = (string *)this;
  Node::Node(&this->super_Node);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__MessageSendNode_0020cb08;
  std::__cxx11::string::string((string *)&this->selector,(string *)receiver_local);
  this->receiver = firstArgument_local;
  std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::vector(&this->arguments)
  ;
  std::vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>::
  vector(&this->chainedMessages);
  std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::push_back
            (&this->arguments,&local_28);
  return;
}

Assistant:

MessageSendNode::MessageSendNode(const std::string &selector, Node *receiver, Node *firstArgument)
	: selector(selector), receiver(receiver)
{
	arguments.push_back(firstArgument);
}